

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

void uv__signal_unregister_handler(int signum)

{
  int iVar1;
  _union_1457 local_a8;
  sigaction sa;
  int signum_local;
  
  sa.sa_restorer._4_4_ = signum;
  memset(&local_a8,0,0x98);
  local_a8.sa_handler = (__sighandler_t)0x0;
  iVar1 = sigaction(sa.sa_restorer._4_4_,(sigaction *)&local_a8,(sigaction *)0x0);
  if (iVar1 != 0) {
    abort();
  }
  return;
}

Assistant:

static void uv__signal_unregister_handler(int signum) {
  /* When this function is called, the signal lock must be held. */
  struct sigaction sa;

  memset(&sa, 0, sizeof(sa));
  sa.sa_handler = SIG_DFL;

  /* sigaction can only fail with EINVAL or EFAULT; an attempt to deregister a
   * signal implies that it was successfully registered earlier, so EINVAL
   * should never happen.
   */
  if (sigaction(signum, &sa, NULL))
    abort();
}